

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  int iVar14;
  ulong uVar15;
  undefined8 uVar16;
  RTCRayQueryContext *pRVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 (*pauVar23) [16];
  uint uVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  int *piVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  undefined4 uVar35;
  ulong unaff_R12;
  long lVar36;
  float fVar37;
  float fVar48;
  float fVar49;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 auVar47 [16];
  float fVar51;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar69;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  uint uVar77;
  float fVar81;
  uint uVar82;
  float fVar83;
  uint uVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  uint uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  uint uVar94;
  float fVar95;
  uint uVar96;
  float fVar97;
  uint uVar98;
  float fVar99;
  uint uVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_116c;
  undefined8 local_1168;
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [16];
  RTCIntersectArguments *local_1140;
  RTCFilterFunctionNArguments local_1138;
  undefined1 local_1108 [16];
  Scene *local_10f0;
  float local_10e8;
  undefined4 local_10e4;
  float local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar34 = (undefined1 (*) [16])local_f68;
      fVar110 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_f98 = 0.0;
      if (0.0 <= fVar110) {
        local_f98 = fVar110;
      }
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fd8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fa8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar110 = (ray->super_RayK<1>).tfar;
      fVar112 = 0.0;
      if (0.0 <= fVar110) {
        fVar112 = fVar110;
      }
      aVar13 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar58._4_4_ = -(uint)(ABS(aVar13.y) < DAT_01ff1d40._4_4_);
      auVar58._0_4_ = -(uint)(ABS(aVar13.x) < (float)DAT_01ff1d40);
      auVar58._8_4_ = -(uint)(ABS(aVar13.z) < DAT_01ff1d40._8_4_);
      auVar58._12_4_ = -(uint)(ABS(aVar13.field_3.w) < DAT_01ff1d40._12_4_);
      auVar58 = blendvps((undefined1  [16])aVar13,_DAT_01ff1d40,auVar58);
      auVar66 = rcpps(_DAT_01ff1d40,auVar58);
      local_fe8 = auVar66._0_4_;
      local_ff8 = auVar66._4_4_;
      local_fb8 = auVar66._8_4_;
      local_fe8 = (1.0 - auVar58._0_4_ * local_fe8) * local_fe8 + local_fe8;
      local_ff8 = (1.0 - auVar58._4_4_ * local_ff8) * local_ff8 + local_ff8;
      local_fb8 = (1.0 - auVar58._8_4_ * local_fb8) * local_fb8 + local_fb8;
      uVar30 = (ulong)(local_fe8 < 0.0) * 0x10;
      uVar31 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
      uVar33 = (ulong)(local_fb8 < 0.0) << 4 | 0x40;
      auVar66._4_4_ = fVar112;
      auVar66._0_4_ = fVar112;
      auVar66._8_4_ = fVar112;
      auVar66._12_4_ = fVar112;
      _local_f88 = mm_lookupmask_ps._240_8_;
      _uStack_f80 = mm_lookupmask_ps._248_8_;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fVar110 = local_f98;
      fVar112 = local_f98;
      fVar101 = local_f98;
      fVar104 = local_f98;
      fVar62 = local_fa8;
      fVar64 = local_fa8;
      fVar37 = local_fa8;
      fVar48 = local_fa8;
      fVar49 = local_fb8;
      fVar50 = local_fb8;
      fVar51 = local_fb8;
      fVar54 = local_fb8;
      fVar55 = local_fc8;
      fVar56 = local_fc8;
      fVar57 = local_fc8;
      fVar60 = local_fc8;
      fVar61 = local_fd8;
      fVar63 = local_fd8;
      fVar65 = local_fd8;
      fVar69 = local_fd8;
      fVar76 = local_fe8;
      fVar81 = local_fe8;
      fVar83 = local_fe8;
      fVar85 = local_fe8;
      fVar89 = local_ff8;
      fVar90 = local_ff8;
      fVar91 = local_ff8;
      fVar92 = local_ff8;
      do {
        do {
          do {
            if (pauVar34 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar23 = pauVar34 + -1;
            pauVar34 = pauVar34 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar23 + 8));
          uVar28 = *(ulong *)*pauVar34;
          do {
            if ((uVar28 & 8) == 0) {
              fVar93 = (ray->super_RayK<1>).dir.field_0.m128[3];
              uVar26 = uVar28 & 0xfffffffffffffff0;
              pfVar3 = (float *)(uVar26 + 0x80 + uVar30);
              pfVar1 = (float *)(uVar26 + 0x20 + uVar30);
              auVar75._0_4_ = ((*pfVar3 * fVar93 + *pfVar1) - fVar55) * fVar76;
              auVar75._4_4_ = ((pfVar3[1] * fVar93 + pfVar1[1]) - fVar56) * fVar81;
              auVar75._8_4_ = ((pfVar3[2] * fVar93 + pfVar1[2]) - fVar57) * fVar83;
              auVar75._12_4_ = ((pfVar3[3] * fVar93 + pfVar1[3]) - fVar60) * fVar85;
              auVar71._4_4_ = fVar112;
              auVar71._0_4_ = fVar110;
              auVar71._8_4_ = fVar101;
              auVar71._12_4_ = fVar104;
              pfVar3 = (float *)(uVar26 + 0x80 + uVar31);
              pfVar1 = (float *)(uVar26 + 0x20 + uVar31);
              auVar58 = maxps(auVar71,auVar75);
              auVar70._0_4_ = ((*pfVar3 * fVar93 + *pfVar1) - fVar61) * fVar89;
              auVar70._4_4_ = ((pfVar3[1] * fVar93 + pfVar1[1]) - fVar63) * fVar90;
              auVar70._8_4_ = ((pfVar3[2] * fVar93 + pfVar1[2]) - fVar65) * fVar91;
              auVar70._12_4_ = ((pfVar3[3] * fVar93 + pfVar1[3]) - fVar69) * fVar92;
              pfVar3 = (float *)(uVar26 + 0x80 + uVar33);
              pfVar1 = (float *)(uVar26 + 0x20 + uVar33);
              auVar80._0_4_ = ((*pfVar3 * fVar93 + *pfVar1) - fVar62) * fVar49;
              auVar80._4_4_ = ((pfVar3[1] * fVar93 + pfVar1[1]) - fVar64) * fVar50;
              auVar80._8_4_ = ((pfVar3[2] * fVar93 + pfVar1[2]) - fVar37) * fVar51;
              auVar80._12_4_ = ((pfVar3[3] * fVar93 + pfVar1[3]) - fVar48) * fVar54;
              auVar71 = maxps(auVar70,auVar80);
              local_10b8 = maxps(auVar58,auVar71);
              pfVar4 = (float *)(uVar26 + 0x80 + (uVar30 ^ 0x10));
              pfVar1 = (float *)(uVar26 + 0x20 + (uVar30 ^ 0x10));
              pfVar5 = (float *)(uVar26 + 0x80 + (uVar31 ^ 0x10));
              pfVar3 = (float *)(uVar26 + 0x20 + (uVar31 ^ 0x10));
              auVar72._0_4_ = ((*pfVar4 * fVar93 + *pfVar1) - fVar55) * fVar76;
              auVar72._4_4_ = ((pfVar4[1] * fVar93 + pfVar1[1]) - fVar56) * fVar81;
              auVar72._8_4_ = ((pfVar4[2] * fVar93 + pfVar1[2]) - fVar57) * fVar83;
              auVar72._12_4_ = ((pfVar4[3] * fVar93 + pfVar1[3]) - fVar60) * fVar85;
              auVar78._0_4_ = ((*pfVar5 * fVar93 + *pfVar3) - fVar61) * fVar89;
              auVar78._4_4_ = ((pfVar5[1] * fVar93 + pfVar3[1]) - fVar63) * fVar90;
              auVar78._8_4_ = ((pfVar5[2] * fVar93 + pfVar3[2]) - fVar65) * fVar91;
              auVar78._12_4_ = ((pfVar5[3] * fVar93 + pfVar3[3]) - fVar69) * fVar92;
              pfVar3 = (float *)(uVar26 + 0x80 + (uVar33 ^ 0x10));
              pfVar1 = (float *)(uVar26 + 0x20 + (uVar33 ^ 0x10));
              auVar88._0_4_ = ((*pfVar3 * fVar93 + *pfVar1) - fVar62) * fVar49;
              auVar88._4_4_ = ((pfVar3[1] * fVar93 + pfVar1[1]) - fVar64) * fVar50;
              auVar88._8_4_ = ((pfVar3[2] * fVar93 + pfVar1[2]) - fVar37) * fVar51;
              auVar88._12_4_ = ((pfVar3[3] * fVar93 + pfVar1[3]) - fVar48) * fVar54;
              auVar71 = minps(auVar78,auVar88);
              auVar58 = minps(auVar66,auVar72);
              auVar58 = minps(auVar58,auVar71);
              if (((uint)uVar28 & 7) == 6) {
                bVar18 = (fVar93 < *(float *)(uVar26 + 0xf0) && *(float *)(uVar26 + 0xe0) <= fVar93)
                         && local_10b8._0_4_ <= auVar58._0_4_;
                bVar19 = (fVar93 < *(float *)(uVar26 + 0xf4) && *(float *)(uVar26 + 0xe4) <= fVar93)
                         && local_10b8._4_4_ <= auVar58._4_4_;
                bVar20 = (fVar93 < *(float *)(uVar26 + 0xf8) && *(float *)(uVar26 + 0xe8) <= fVar93)
                         && local_10b8._8_4_ <= auVar58._8_4_;
                bVar21 = (fVar93 < *(float *)(uVar26 + 0xfc) && *(float *)(uVar26 + 0xec) <= fVar93)
                         && local_10b8._12_4_ <= auVar58._12_4_;
              }
              else {
                bVar18 = local_10b8._0_4_ <= auVar58._0_4_;
                bVar19 = local_10b8._4_4_ <= auVar58._4_4_;
                bVar20 = local_10b8._8_4_ <= auVar58._8_4_;
                bVar21 = local_10b8._12_4_ <= auVar58._12_4_;
              }
              auVar38._0_4_ = (uint)bVar18 * -0x80000000;
              auVar38._4_4_ = (uint)bVar19 * -0x80000000;
              auVar38._8_4_ = (uint)bVar20 * -0x80000000;
              auVar38._12_4_ = (uint)bVar21 * -0x80000000;
              uVar35 = movmskps((int)unaff_R12,auVar38);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar35);
            }
            if ((uVar28 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar25 = 4;
              }
              else {
                uVar26 = uVar28 & 0xfffffffffffffff0;
                lVar36 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                iVar25 = 0;
                uVar28 = *(ulong *)(uVar26 + lVar36 * 8);
                uVar32 = unaff_R12 - 1 & unaff_R12;
                if (uVar32 != 0) {
                  uVar24 = *(uint *)(local_10b8 + lVar36 * 4);
                  lVar36 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                    }
                  }
                  uVar15 = *(ulong *)(uVar26 + lVar36 * 8);
                  uVar77 = *(uint *)(local_10b8 + lVar36 * 4);
                  uVar32 = uVar32 - 1 & uVar32;
                  if (uVar32 == 0) {
                    if (uVar24 < uVar77) {
                      *(ulong *)*pauVar34 = uVar15;
                      *(uint *)((long)*pauVar34 + 8) = uVar77;
                      pauVar34 = pauVar34 + 1;
                    }
                    else {
                      *(ulong *)*pauVar34 = uVar28;
                      *(uint *)((long)*pauVar34 + 8) = uVar24;
                      uVar28 = uVar15;
                      pauVar34 = pauVar34 + 1;
                    }
                  }
                  else {
                    auVar59._8_4_ = uVar24;
                    auVar59._0_8_ = uVar28;
                    auVar59._12_4_ = 0;
                    auVar73._8_4_ = uVar77;
                    auVar73._0_8_ = uVar15;
                    auVar73._12_4_ = 0;
                    lVar36 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                      }
                    }
                    uVar16 = *(undefined8 *)(uVar26 + lVar36 * 8);
                    iVar14 = *(int *)(local_10b8 + lVar36 * 4);
                    auVar67._8_4_ = iVar14;
                    auVar67._0_8_ = uVar16;
                    auVar67._12_4_ = 0;
                    auVar39._8_4_ = -(uint)((int)uVar24 < (int)uVar77);
                    uVar32 = uVar32 - 1 & uVar32;
                    if (uVar32 == 0) {
                      auVar39._4_4_ = auVar39._8_4_;
                      auVar39._0_4_ = auVar39._8_4_;
                      auVar39._12_4_ = auVar39._8_4_;
                      auVar79._8_4_ = uVar77;
                      auVar79._0_8_ = uVar15;
                      auVar79._12_4_ = 0;
                      auVar71 = blendvps(auVar79,auVar59,auVar39);
                      auVar58 = blendvps(auVar59,auVar73,auVar39);
                      auVar40._8_4_ = -(uint)(auVar71._8_4_ < iVar14);
                      auVar40._4_4_ = auVar40._8_4_;
                      auVar40._0_4_ = auVar40._8_4_;
                      auVar40._12_4_ = auVar40._8_4_;
                      auVar74._8_4_ = iVar14;
                      auVar74._0_8_ = uVar16;
                      auVar74._12_4_ = 0;
                      auVar75 = blendvps(auVar74,auVar71,auVar40);
                      auVar80 = blendvps(auVar71,auVar67,auVar40);
                      auVar41._8_4_ = -(uint)(auVar58._8_4_ < auVar80._8_4_);
                      auVar41._4_4_ = auVar41._8_4_;
                      auVar41._0_4_ = auVar41._8_4_;
                      auVar41._12_4_ = auVar41._8_4_;
                      auVar71 = blendvps(auVar80,auVar58,auVar41);
                      auVar58 = blendvps(auVar58,auVar80,auVar41);
                      *pauVar34 = auVar58;
                      pauVar34[1] = auVar71;
                      uVar28 = auVar75._0_8_;
                      pauVar34 = pauVar34 + 2;
                    }
                    else {
                      lVar36 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                        }
                      }
                      auVar42._4_4_ = auVar39._8_4_;
                      auVar42._0_4_ = auVar39._8_4_;
                      auVar42._8_4_ = auVar39._8_4_;
                      auVar42._12_4_ = auVar39._8_4_;
                      auVar80 = blendvps(auVar73,auVar59,auVar42);
                      auVar58 = blendvps(auVar59,auVar73,auVar42);
                      auVar87._8_4_ = *(int *)(local_10b8 + lVar36 * 4);
                      auVar87._0_8_ = *(undefined8 *)(uVar26 + lVar36 * 8);
                      auVar87._12_4_ = 0;
                      auVar43._8_4_ = -(uint)(iVar14 < *(int *)(local_10b8 + lVar36 * 4));
                      auVar43._4_4_ = auVar43._8_4_;
                      auVar43._0_4_ = auVar43._8_4_;
                      auVar43._12_4_ = auVar43._8_4_;
                      auVar75 = blendvps(auVar87,auVar67,auVar43);
                      auVar71 = blendvps(auVar67,auVar87,auVar43);
                      auVar44._8_4_ = -(uint)(auVar58._8_4_ < auVar71._8_4_);
                      auVar44._4_4_ = auVar44._8_4_;
                      auVar44._0_4_ = auVar44._8_4_;
                      auVar44._12_4_ = auVar44._8_4_;
                      auVar88 = blendvps(auVar71,auVar58,auVar44);
                      auVar58 = blendvps(auVar58,auVar71,auVar44);
                      auVar45._8_4_ = -(uint)(auVar80._8_4_ < auVar75._8_4_);
                      auVar45._4_4_ = auVar45._8_4_;
                      auVar45._0_4_ = auVar45._8_4_;
                      auVar45._12_4_ = auVar45._8_4_;
                      auVar71 = blendvps(auVar75,auVar80,auVar45);
                      auVar80 = blendvps(auVar80,auVar75,auVar45);
                      auVar46._8_4_ = -(uint)(auVar80._8_4_ < auVar88._8_4_);
                      auVar46._4_4_ = auVar46._8_4_;
                      auVar46._0_4_ = auVar46._8_4_;
                      auVar46._12_4_ = auVar46._8_4_;
                      auVar75 = blendvps(auVar88,auVar80,auVar46);
                      auVar80 = blendvps(auVar80,auVar88,auVar46);
                      *pauVar34 = auVar58;
                      pauVar34[1] = auVar80;
                      pauVar34[2] = auVar75;
                      uVar28 = auVar71._0_8_;
                      pauVar34 = pauVar34 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar25 = 6;
            }
          } while (iVar25 == 0);
        } while (iVar25 != 6);
        uVar26 = (ulong)((uint)uVar28 & 0xf);
        if (uVar26 != 8) {
          uVar28 = uVar28 & 0xfffffffffffffff0;
          lVar36 = 0;
          uVar24 = 6;
          do {
            lVar29 = lVar36 * 0x140;
            fVar110 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar3 = (float *)(uVar28 + 0x90 + lVar29);
            pfVar1 = (float *)(uVar28 + lVar29);
            fVar65 = *pfVar3 * fVar110 + *pfVar1;
            fVar69 = pfVar3[1] * fVar110 + pfVar1[1];
            fStack_1160 = pfVar3[2] * fVar110 + pfVar1[2];
            fStack_115c = pfVar3[3] * fVar110 + pfVar1[3];
            pfVar3 = (float *)(uVar28 + 0xa0 + lVar29);
            pfVar1 = (float *)(uVar28 + 0x10 + lVar29);
            fVar57 = *pfVar3 * fVar110 + *pfVar1;
            fVar60 = pfVar3[1] * fVar110 + pfVar1[1];
            fVar61 = pfVar3[2] * fVar110 + pfVar1[2];
            fVar63 = pfVar3[3] * fVar110 + pfVar1[3];
            pfVar3 = (float *)(uVar28 + 0xb0 + lVar29);
            pfVar1 = (float *)(uVar28 + 0x20 + lVar29);
            fVar37 = *pfVar3 * fVar110 + *pfVar1;
            fVar48 = pfVar3[1] * fVar110 + pfVar1[1];
            fVar49 = pfVar3[2] * fVar110 + pfVar1[2];
            fVar50 = pfVar3[3] * fVar110 + pfVar1[3];
            pfVar6 = (float *)(uVar28 + 0xc0 + lVar29);
            pfVar1 = (float *)(uVar28 + 0x30 + lVar29);
            pfVar7 = (float *)(uVar28 + 0xd0 + lVar29);
            pfVar3 = (float *)(uVar28 + 0x40 + lVar29);
            pfVar8 = (float *)(uVar28 + 0xe0 + lVar29);
            pfVar4 = (float *)(uVar28 + 0x50 + lVar29);
            pfVar9 = (float *)(uVar28 + 0xf0 + lVar29);
            pfVar5 = (float *)(uVar28 + 0x60 + lVar29);
            pfVar10 = (float *)(uVar28 + 0x100 + lVar29);
            pfVar2 = (float *)(uVar28 + 0x70 + lVar29);
            pfVar11 = (float *)(uVar28 + 0x110 + lVar29);
            pfVar12 = (float *)(uVar28 + 0x80 + lVar29);
            fVar93 = fVar65 - (*pfVar6 * fVar110 + *pfVar1);
            fVar95 = fVar69 - (pfVar6[1] * fVar110 + pfVar1[1]);
            fVar97 = fStack_1160 - (pfVar6[2] * fVar110 + pfVar1[2]);
            fVar99 = fStack_115c - (pfVar6[3] * fVar110 + pfVar1[3]);
            fVar105 = fVar57 - (*pfVar7 * fVar110 + *pfVar3);
            fVar106 = fVar60 - (pfVar7[1] * fVar110 + pfVar3[1]);
            fVar107 = fVar61 - (pfVar7[2] * fVar110 + pfVar3[2]);
            fVar108 = fVar63 - (pfVar7[3] * fVar110 + pfVar3[3]);
            fVar109 = fVar37 - (*pfVar8 * fVar110 + *pfVar4);
            fVar111 = fVar48 - (pfVar8[1] * fVar110 + pfVar4[1]);
            fVar113 = fVar49 - (pfVar8[2] * fVar110 + pfVar4[2]);
            fVar115 = fVar50 - (pfVar8[3] * fVar110 + pfVar4[3]);
            fVar51 = (*pfVar9 * fVar110 + *pfVar5) - fVar65;
            fVar54 = (pfVar9[1] * fVar110 + pfVar5[1]) - fVar69;
            fVar55 = (pfVar9[2] * fVar110 + pfVar5[2]) - fStack_1160;
            fVar56 = (pfVar9[3] * fVar110 + pfVar5[3]) - fStack_115c;
            fVar89 = (*pfVar10 * fVar110 + *pfVar2) - fVar57;
            fVar90 = (pfVar10[1] * fVar110 + pfVar2[1]) - fVar60;
            fVar91 = (pfVar10[2] * fVar110 + pfVar2[2]) - fVar61;
            fVar92 = (pfVar10[3] * fVar110 + pfVar2[3]) - fVar63;
            fVar76 = (fVar110 * *pfVar11 + *pfVar12) - fVar37;
            fVar81 = (fVar110 * pfVar11[1] + pfVar12[1]) - fVar48;
            fVar83 = (fVar110 * pfVar11[2] + pfVar12[2]) - fVar49;
            fVar85 = (fVar110 * pfVar11[3] + pfVar12[3]) - fVar50;
            local_1028._0_4_ = fVar109 * fVar89 - fVar105 * fVar76;
            local_1028._4_4_ = fVar111 * fVar90 - fVar106 * fVar81;
            local_1028._8_4_ = fVar113 * fVar91 - fVar107 * fVar83;
            local_1028._12_4_ = fVar115 * fVar92 - fVar108 * fVar85;
            fVar110 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar112 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar101 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar104 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar62 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar64 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar65 = fVar65 - fVar110;
            fVar69 = fVar69 - fVar110;
            fStack_1160 = fStack_1160 - fVar110;
            fStack_115c = fStack_115c - fVar110;
            fVar57 = fVar57 - fVar112;
            fVar60 = fVar60 - fVar112;
            fVar61 = fVar61 - fVar112;
            fVar63 = fVar63 - fVar112;
            fVar121 = fVar65 * fVar62 - fVar57 * fVar104;
            fVar122 = fVar69 * fVar62 - fVar60 * fVar104;
            fVar123 = fStack_1160 * fVar62 - fVar61 * fVar104;
            fVar124 = fStack_115c * fVar62 - fVar63 * fVar104;
            local_1018._0_4_ = fVar93 * fVar76 - fVar109 * fVar51;
            local_1018._4_4_ = fVar95 * fVar81 - fVar111 * fVar54;
            local_1018._8_4_ = fVar97 * fVar83 - fVar113 * fVar55;
            local_1018._12_4_ = fVar99 * fVar85 - fVar115 * fVar56;
            fVar37 = fVar37 - fVar101;
            fVar48 = fVar48 - fVar101;
            fVar49 = fVar49 - fVar101;
            fVar50 = fVar50 - fVar101;
            local_1168 = (Geometry *)CONCAT44(fVar69,fVar65);
            fVar117 = fVar37 * fVar104 - fVar65 * fVar64;
            fVar118 = fVar48 * fVar104 - fVar69 * fVar64;
            fVar119 = fVar49 * fVar104 - fStack_1160 * fVar64;
            fVar120 = fVar50 * fVar104 - fStack_115c * fVar64;
            local_1008[0] = fVar105 * fVar51 - fVar93 * fVar89;
            local_1008[1] = fVar106 * fVar54 - fVar95 * fVar90;
            local_1008[2] = fVar107 * fVar55 - fVar97 * fVar91;
            local_1008[3] = fVar108 * fVar56 - fVar99 * fVar92;
            fVar110 = fVar57 * fVar64 - fVar37 * fVar62;
            fVar112 = fVar60 * fVar64 - fVar48 * fVar62;
            fVar114 = fVar61 * fVar64 - fVar49 * fVar62;
            fVar116 = fVar63 * fVar64 - fVar50 * fVar62;
            fVar101 = fVar104 * local_1028._0_4_ +
                      fVar62 * local_1018._0_4_ + fVar64 * local_1008[0];
            fVar102 = fVar104 * local_1028._4_4_ +
                      fVar62 * local_1018._4_4_ + fVar64 * local_1008[1];
            fVar103 = fVar104 * local_1028._8_4_ +
                      fVar62 * local_1018._8_4_ + fVar64 * local_1008[2];
            fVar104 = fVar104 * local_1028._12_4_ +
                      fVar62 * local_1018._12_4_ + fVar64 * local_1008[3];
            uVar77 = (uint)fVar101 & 0x80000000;
            uVar82 = (uint)fVar102 & 0x80000000;
            uVar84 = (uint)fVar103 & 0x80000000;
            uVar86 = (uint)fVar104 & 0x80000000;
            local_10b8._0_4_ =
                 (float)((uint)(fVar51 * fVar110 + fVar89 * fVar117 + fVar76 * fVar121) ^ uVar77);
            local_10b8._4_4_ =
                 (float)((uint)(fVar54 * fVar112 + fVar90 * fVar118 + fVar81 * fVar122) ^ uVar82);
            local_10b8._8_4_ =
                 (float)((uint)(fVar55 * fVar114 + fVar91 * fVar119 + fVar83 * fVar123) ^ uVar84);
            local_10b8._12_4_ =
                 (float)((uint)(fVar56 * fVar116 + fVar92 * fVar120 + fVar85 * fVar124) ^ uVar86);
            local_10a8 = (float)((uint)(fVar110 * fVar93 + fVar117 * fVar105 + fVar121 * fVar109) ^
                                uVar77);
            fStack_10a4 = (float)((uint)(fVar112 * fVar95 + fVar118 * fVar106 + fVar122 * fVar111) ^
                                 uVar82);
            fStack_10a0 = (float)((uint)(fVar114 * fVar97 + fVar119 * fVar107 + fVar123 * fVar113) ^
                                 uVar84);
            fStack_109c = (float)((uint)(fVar116 * fVar99 + fVar120 * fVar108 + fVar124 * fVar115) ^
                                 uVar86);
            fVar110 = ABS(fVar101);
            fVar112 = ABS(fVar102);
            local_1088._0_8_ = CONCAT44(fVar102,fVar101) & 0x7fffffff7fffffff;
            local_1088._8_4_ = ABS(fVar103);
            local_1088._12_4_ = ABS(fVar104);
            uVar94 = -(uint)(local_10b8._0_4_ + local_10a8 <= fVar110) &
                     -(uint)((0.0 <= local_10a8 && 0.0 <= local_10b8._0_4_) && fVar101 != 0.0) &
                     local_f88;
            uVar96 = -(uint)(local_10b8._4_4_ + fStack_10a4 <= fVar112) &
                     -(uint)((0.0 <= fStack_10a4 && 0.0 <= local_10b8._4_4_) && fVar102 != 0.0) &
                     uStack_f84;
            uVar98 = -(uint)(local_10b8._8_4_ + fStack_10a0 <= local_1088._8_4_) &
                     -(uint)((0.0 <= fStack_10a0 && 0.0 <= local_10b8._8_4_) && fVar103 != 0.0) &
                     uStack_f80;
            uVar100 = -(uint)(local_10b8._12_4_ + fStack_109c <= local_1088._12_4_) &
                      -(uint)((0.0 <= fStack_109c && 0.0 <= local_10b8._12_4_) && fVar104 != 0.0) &
                      uStack_f7c;
            auVar22._4_4_ = uVar96;
            auVar22._0_4_ = uVar94;
            auVar22._8_4_ = uVar98;
            auVar22._12_4_ = uVar100;
            uVar24 = movmskps(uVar24,auVar22);
            if (uVar24 != 0) {
              local_1098._0_4_ =
                   (float)(uVar77 ^ (uint)(fVar65 * local_1028._0_4_ +
                                          fVar57 * local_1018._0_4_ + fVar37 * local_1008[0]));
              local_1098._4_4_ =
                   (float)(uVar82 ^ (uint)(fVar69 * local_1028._4_4_ +
                                          fVar60 * local_1018._4_4_ + fVar48 * local_1008[1]));
              local_1098._8_4_ =
                   (float)(uVar84 ^ (uint)(fStack_1160 * local_1028._8_4_ +
                                          fVar61 * local_1018._8_4_ + fVar49 * local_1008[2]));
              local_1098._12_4_ =
                   (float)(uVar86 ^ (uint)(fStack_115c * local_1028._12_4_ +
                                          fVar63 * local_1018._12_4_ + fVar50 * local_1008[3]));
              fVar101 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar104 = (ray->super_RayK<1>).tfar;
              auVar47._0_4_ =
                   -(uint)(local_1098._0_4_ <= fVar104 * fVar110 &&
                          fVar101 * fVar110 < local_1098._0_4_) & uVar94;
              auVar47._4_4_ =
                   -(uint)(local_1098._4_4_ <= fVar104 * fVar112 &&
                          fVar101 * fVar112 < local_1098._4_4_) & uVar96;
              auVar47._8_4_ =
                   -(uint)(local_1098._8_4_ <= fVar104 * local_1088._8_4_ &&
                          fVar101 * local_1088._8_4_ < local_1098._8_4_) & uVar98;
              auVar47._12_4_ =
                   -(uint)(local_1098._12_4_ <= fVar104 * local_1088._12_4_ &&
                          fVar101 * local_1088._12_4_ < local_1098._12_4_) & uVar100;
              uVar24 = movmskps(uVar24,auVar47);
              if (uVar24 != 0) {
                local_1068 = auVar47;
                auVar58 = rcpps(local_10b8,local_1088);
                fVar101 = auVar58._0_4_;
                fVar104 = auVar58._4_4_;
                fVar62 = auVar58._8_4_;
                fVar64 = auVar58._12_4_;
                fVar101 = (1.0 - fVar110 * fVar101) * fVar101 + fVar101;
                fVar104 = (1.0 - fVar112 * fVar104) * fVar104 + fVar104;
                fVar62 = (1.0 - local_1088._8_4_ * fVar62) * fVar62 + fVar62;
                fVar64 = (1.0 - local_1088._12_4_ * fVar64) * fVar64 + fVar64;
                local_1038._0_4_ = local_1098._0_4_ * fVar101;
                local_1038._4_4_ = local_1098._4_4_ * fVar104;
                local_1038._8_4_ = local_1098._8_4_ * fVar62;
                local_1038._12_4_ = local_1098._12_4_ * fVar64;
                local_1058[0] = local_10b8._0_4_ * fVar101;
                local_1058[1] = local_10b8._4_4_ * fVar104;
                local_1058[2] = local_10b8._8_4_ * fVar62;
                local_1058[3] = local_10b8._12_4_ * fVar64;
                local_1158 = auVar47;
                local_1048[0] = fVar101 * local_10a8;
                local_1048[1] = fVar104 * fStack_10a4;
                local_1048[2] = fVar62 * fStack_10a0;
                local_1048[3] = fVar64 * fStack_109c;
                auVar66 = blendvps(_DAT_01feb9f0,local_1038,auVar47);
                auVar68._4_4_ = auVar66._0_4_;
                auVar68._0_4_ = auVar66._4_4_;
                auVar68._8_4_ = auVar66._12_4_;
                auVar68._12_4_ = auVar66._8_4_;
                auVar58 = minps(auVar68,auVar66);
                auVar52._0_8_ = auVar58._8_8_;
                auVar52._8_4_ = auVar58._0_4_;
                auVar52._12_4_ = auVar58._4_4_;
                auVar58 = minps(auVar52,auVar58);
                auVar53._0_8_ =
                     CONCAT44(-(uint)(auVar58._4_4_ == auVar66._4_4_) & auVar47._4_4_,
                              -(uint)(auVar58._0_4_ == auVar66._0_4_) & auVar47._0_4_);
                auVar53._8_4_ = -(uint)(auVar58._8_4_ == auVar66._8_4_) & auVar47._8_4_;
                auVar53._12_4_ = -(uint)(auVar58._12_4_ == auVar66._12_4_) & auVar47._12_4_;
                iVar25 = movmskps((int)context,auVar53);
                if (iVar25 != 0) {
                  auVar47._8_4_ = auVar53._8_4_;
                  auVar47._0_8_ = auVar53._0_8_;
                  auVar47._12_4_ = auVar53._12_4_;
                }
                lVar29 = lVar29 + uVar28;
                uVar35 = movmskps(iVar25,auVar47);
                uVar32 = CONCAT44((int)((ulong)context >> 0x20),uVar35);
                piVar27 = (int *)0x0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> (long)piVar27 & 1) == 0; piVar27 = (int *)((long)piVar27 + 1)) {
                  }
                }
                local_10f0 = context->scene;
                auVar58 = local_1038;
                do {
                  uVar24 = *(uint *)(lVar29 + 0x120 + (long)piVar27 * 4);
                  local_1168 = (local_10f0->geometries).items[uVar24].ptr;
                  if ((local_1168->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1158 + (long)piVar27 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1168->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar110 = local_1058[(long)piVar27];
                      fVar112 = local_1048[(long)piVar27];
                      (ray->super_RayK<1>).tfar = *(float *)(local_1038 + (long)piVar27 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + (long)piVar27 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + (long)piVar27 * 4);
                      (ray->Ng).field_0.field_0.z = local_1008[(long)piVar27];
                      ray->u = fVar110;
                      ray->v = fVar112;
                      ray->primID = *(uint *)(lVar29 + 0x130 + (long)piVar27 * 4);
                      ray->geomID = uVar24;
                      pRVar17 = context->user;
                      ray->instID[0] = pRVar17->instID[0];
                      uVar24 = pRVar17->instPrimID[0];
                      ray->instPrimID[0] = uVar24;
                      break;
                    }
                    local_1140 = context->args;
                    local_1108 = auVar58;
                    local_1138.context = context->user;
                    local_10e8 = *(float *)(local_1028 + (long)piVar27 * 4);
                    local_10e4 = *(undefined4 *)(local_1018 + (long)piVar27 * 4);
                    local_10e0 = local_1008[(long)piVar27];
                    local_10dc = local_1058[(long)piVar27];
                    local_10d8 = local_1048[(long)piVar27];
                    local_10d4 = *(undefined4 *)(lVar29 + 0x130 + (long)piVar27 * 4);
                    local_10d0 = uVar24;
                    local_10cc = (local_1138.context)->instID[0];
                    local_10c8 = (local_1138.context)->instPrimID[0];
                    fVar110 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1038 + (long)piVar27 * 4);
                    local_116c = -1;
                    local_1138.valid = &local_116c;
                    local_1138.geometryUserPtr = local_1168->userPtr;
                    local_1138.ray = (RTCRayN *)ray;
                    local_1138.hit = (RTCHitN *)&local_10e8;
                    local_1138.N = 1;
                    if ((local_1168->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_1168->intersectionFilterN)(&local_1138), *local_1138.valid != 0)) {
                      if (local_1140->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1140->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_1168->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_1140->filter)(&local_1138);
                        }
                        if (*local_1138.valid == 0) goto LAB_00e76993;
                      }
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1138.hit;
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1138.hit + 4);
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1138.hit + 8);
                      *(float *)((long)local_1138.ray + 0x3c) = *(float *)(local_1138.hit + 0xc);
                      *(float *)((long)local_1138.ray + 0x40) = *(float *)(local_1138.hit + 0x10);
                      *(float *)((long)local_1138.ray + 0x44) = *(float *)(local_1138.hit + 0x14);
                      *(float *)((long)local_1138.ray + 0x48) = *(float *)(local_1138.hit + 0x18);
                      *(float *)((long)local_1138.ray + 0x4c) = *(float *)(local_1138.hit + 0x1c);
                      *(float *)((long)local_1138.ray + 0x50) = *(float *)(local_1138.hit + 0x20);
                    }
                    else {
LAB_00e76993:
                      (ray->super_RayK<1>).tfar = fVar110;
                    }
                    *(undefined4 *)(local_1158 + (long)piVar27 * 4) = 0;
                    fVar110 = (ray->super_RayK<1>).tfar;
                    local_1158._4_4_ = -(uint)(local_1108._4_4_ <= fVar110) & local_1158._4_4_;
                    local_1158._0_4_ = -(uint)(local_1108._0_4_ <= fVar110) & local_1158._0_4_;
                    local_1158._8_4_ = -(uint)(local_1108._8_4_ <= fVar110) & local_1158._8_4_;
                    local_1158._12_4_ = -(uint)(local_1108._12_4_ <= fVar110) & local_1158._12_4_;
                    auVar58 = local_1108;
                  }
                  uVar24 = movmskps((int)piVar27,local_1158);
                  if (uVar24 == 0) break;
                  local_1108 = auVar58;
                  BVHNIntersector1<4,16777232,false,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar27 = local_1138.valid;
                  auVar58 = local_1108;
                } while( true );
              }
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != uVar26 - 8);
        }
        fVar110 = (ray->super_RayK<1>).tfar;
        auVar66._4_4_ = fVar110;
        auVar66._0_4_ = fVar110;
        auVar66._8_4_ = fVar110;
        auVar66._12_4_ = fVar110;
        fVar110 = local_f98;
        fVar112 = fStack_f94;
        fVar101 = fStack_f90;
        fVar104 = fStack_f8c;
        fVar62 = local_fa8;
        fVar64 = fStack_fa4;
        fVar37 = fStack_fa0;
        fVar48 = fStack_f9c;
        fVar49 = local_fb8;
        fVar50 = fStack_fb4;
        fVar51 = fStack_fb0;
        fVar54 = fStack_fac;
        fVar55 = local_fc8;
        fVar56 = fStack_fc4;
        fVar57 = fStack_fc0;
        fVar60 = fStack_fbc;
        fVar61 = local_fd8;
        fVar63 = fStack_fd4;
        fVar65 = fStack_fd0;
        fVar69 = fStack_fcc;
        fVar76 = local_fe8;
        fVar81 = fStack_fe4;
        fVar83 = fStack_fe0;
        fVar85 = fStack_fdc;
        fVar89 = local_ff8;
        fVar90 = fStack_ff4;
        fVar91 = fStack_ff0;
        fVar92 = fStack_fec;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }